

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialMatrix * __thiscall
RigidBodyDynamics::Math::SpatialTransform::toMatrixAdjoint(SpatialTransform *this)

{
  CoeffReturnType pdVar1;
  SpatialMatrix *in_RDI;
  Matrix3d _Erx;
  SpatialMatrix *result;
  Index in_stack_fffffffffffffde8;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffffdf0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *this_01;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffe08;
  double *in_stack_fffffffffffffe58;
  double *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  double *in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe78;
  Matrix3_t *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  double *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  undefined8 local_e8;
  double local_e0;
  double local_d8 [3];
  undefined8 local_c0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_70;
  
  local_c0 = 0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_d8[2] = -*pdVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_d8[1] = 0.0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_d8[0] = -*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_e0 = -*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_e8 = 0;
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_d8;
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_e0;
  this_01 = (DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)&local_e8;
  Matrix3_t::Matrix3_t
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffea8);
  local_70 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(this_00,other);
  Matrix3_t::
  Matrix3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix3_t *)this_00,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)other);
  SpatialMatrix_t::SpatialMatrix_t((SpatialMatrix_t *)0x154c25);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_01,(Index)pdVar1,(Index)this_00);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_00,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-(in_stack_fffffffffffffe08);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_01,(Index)pdVar1,(Index)this_00);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_00,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero((Index)pdVar1,(Index)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_01,(Index)pdVar1,(Index)this_00);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_00,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)other);
  Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
            (this_01,(Index)pdVar1,(Index)this_00);
  Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false> *)this_00,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
  return in_RDI;
}

Assistant:

SpatialMatrix toMatrixAdjoint () const {
		Matrix3d _Erx =
			E * Matrix3d (
					0., -r[2], r[1],
					r[2], 0., -r[0],
					-r[1], r[0], 0.
					);
		SpatialMatrix result;
		result.block<3,3>(0,0) = E;
		result.block<3,3>(0,3) = -_Erx;
		result.block<3,3>(3,0) = Matrix3d::Zero(3,3);
		result.block<3,3>(3,3) = E;

		return result;
	}